

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)

{
  bitstrm_t *ps_bitstrm;
  sps_t *psVar1;
  sps_t *psVar2;
  short sVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  short sVar8;
  WORD16 WVar9;
  UWORD32 UVar10;
  UWORD32 UVar11;
  UWORD32 UVar12;
  uint uVar13;
  byte bVar14;
  WORD32 in_ECX;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  stref_picset_t *ps_stref_picset;
  uint uVar18;
  int iVar19;
  int iVar20;
  UWORD32 profile_present;
  int iVar21;
  bool bVar22;
  profile_tier_lvl_info_t s_ptl;
  profile_tier_lvl_info_t local_193;
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  UVar10 = ihevcd_bits_get(ps_bitstrm,4);
  if ((int)UVar10 < 1) {
    UVar10 = 0;
  }
  UVar12 = 0xf;
  if ((int)UVar10 < 0xf) {
    UVar12 = UVar10;
  }
  UVar10 = ihevcd_bits_get(ps_bitstrm,3);
  if ((int)UVar10 < 1) {
    UVar10 = 0;
  }
  profile_present = 6;
  if ((int)UVar10 < 6) {
    profile_present = UVar10;
  }
  UVar10 = ihevcd_bits_get(ps_bitstrm,1);
  ihevcd_profile_tier_level(ps_bitstrm,&local_193,profile_present,in_ECX);
  UVar11 = ihevcd_uev(ps_bitstrm);
  if ((0x10 < UVar11) && (UVar11 = 0, ps_codec->i4_sps_done != 0)) {
    return IHEVCD_UNSUPPORTED_SPS_ID;
  }
  psVar1 = (ps_codec->s_parse).ps_sps_base;
  psVar1[0x10].i1_sps_id = (WORD8)UVar11;
  psVar1[0x10].i1_vps_id = (WORD8)UVar12;
  psVar1[0x10].i1_sps_max_sub_layers = (char)profile_present + '\x01';
  psVar1[0x10].i1_sps_temporal_id_nesting_flag = (WORD8)UVar10;
  ps_codec->i4_sps_id = UVar11;
  memcpy(&psVar1[0x10].s_ptl,&local_193,0x163);
  UVar10 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_chroma_format_idc = (char)UVar10;
  if ((char)UVar10 != '\x01') {
    (ps_codec->s_parse).i4_error_code = 0xda;
    return 0xda;
  }
  psVar1[0x10].i1_separate_colour_plane_flag = '\0';
  UVar10 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i2_pic_width_in_luma_samples = (WORD16)UVar10;
  UVar10 = ihevcd_uev(ps_bitstrm);
  sVar8 = (short)UVar10;
  psVar1[0x10].i2_pic_height_in_luma_samples = sVar8;
  if (sVar8 < 1 || psVar1[0x10].i2_pic_width_in_luma_samples < 1) {
    return IHEVCD_INVALID_PARAMETER;
  }
  uVar13 = CONCAT22(sVar8 + 7,psVar1[0x10].i2_pic_width_in_luma_samples + 7) & (uint)DAT_00172540;
  psVar1[0x10].i2_pic_width_in_luma_samples = (short)uVar13;
  psVar1[0x10].i2_pic_height_in_luma_samples = (short)(uVar13 >> 0x10);
  UVar10 = ihevcd_bits_get(ps_bitstrm,1);
  psVar1[0x10].i1_pic_cropping_flag = (char)UVar10;
  if ((char)UVar10 == '\0') {
    psVar1[0x10].i2_pic_crop_left_offset = 0;
    psVar1[0x10].i2_pic_crop_right_offset = 0;
    psVar1[0x10].i2_pic_crop_top_offset = 0;
    WVar9 = 0;
  }
  else {
    UVar10 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i2_pic_crop_left_offset = (WORD16)UVar10;
    UVar10 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i2_pic_crop_right_offset = (WORD16)UVar10;
    UVar10 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].i2_pic_crop_top_offset = (WORD16)UVar10;
    UVar10 = ihevcd_uev(ps_bitstrm);
    WVar9 = (WORD16)UVar10;
  }
  psVar1[0x10].i2_pic_crop_bottom_offset = WVar9;
  UVar10 = ihevcd_uev(ps_bitstrm);
  if (UVar10 != 0) {
    return IHEVCD_UNSUPPORTED_BIT_DEPTH;
  }
  UVar10 = ihevcd_uev(ps_bitstrm);
  if (UVar10 != 0) {
    return IHEVCD_UNSUPPORTED_BIT_DEPTH;
  }
  UVar10 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_log2_max_pic_order_cnt_lsb = (char)UVar10 + '\x04';
  UVar10 = ihevcd_bits_get(ps_bitstrm,1);
  psVar1[0x10].i1_sps_sub_layer_ordering_info_present_flag = (char)UVar10;
  cVar4 = psVar1[0x10].i1_sps_max_sub_layers;
  uVar16 = (ulong)(uint)(int)cVar4;
  if ((char)UVar10 == '\0') {
    lVar17 = (long)(int)cVar4 + -1;
  }
  else {
    if (cVar4 < '\x01') goto LAB_00110770;
    lVar17 = 0;
  }
  do {
    UVar10 = ihevcd_uev(ps_bitstrm);
    cVar4 = (char)UVar10 + '\x01';
    psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar17] = cVar4;
    if ('\x10' < cVar4) {
      return IHEVCD_INVALID_PARAMETER;
    }
    UVar10 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].ai1_sps_max_num_reorder_pics[lVar17] = (char)UVar10;
    if (psVar1[0x10].ai1_sps_max_dec_pic_buffering[lVar17] < (char)UVar10) {
      return IHEVCD_INVALID_PARAMETER;
    }
    UVar10 = ihevcd_uev(ps_bitstrm);
    psVar1[0x10].ai1_sps_max_latency_increase[lVar17] = (WORD8)UVar10;
    lVar17 = lVar17 + 1;
    uVar16 = (ulong)psVar1[0x10].i1_sps_max_sub_layers;
  } while (lVar17 < (long)uVar16);
LAB_00110770:
  if (ps_codec->i4_first_pic_done != 0) {
    psVar2 = (ps_codec->s_parse).ps_sps;
    if ((psVar2->ai1_sps_max_dec_pic_buffering[(long)psVar2->i1_sps_max_sub_layers + -1] !=
         psVar1[0x10].ai1_sps_max_dec_pic_buffering[(long)(int)uVar16 + -1]) ||
       (psVar2->ai1_sps_max_dec_pic_buffering[(long)psVar2->i1_sps_max_sub_layers + 6] !=
        psVar1[0x10].ai1_sps_max_dec_pic_buffering[(long)(int)uVar16 + 6])) {
      ps_codec->i4_reset_flag = 1;
      return 0x2a;
    }
  }
  UVar10 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_log2_min_coding_block_size = (char)UVar10 + '\x03';
  UVar10 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_log2_diff_max_min_coding_block_size = (char)UVar10;
  cVar4 = psVar1[0x10].i1_log2_min_coding_block_size;
  UVar12 = ihevcd_uev(ps_bitstrm);
  psVar1[0x10].i1_log2_min_transform_block_size = (char)UVar12 + '\x02';
  UVar12 = ihevcd_uev(ps_bitstrm);
  cVar5 = (char)UVar12;
  psVar1[0x10].i1_log2_diff_max_min_transform_block_size = cVar5;
  bVar14 = psVar1[0x10].i1_log2_min_transform_block_size + cVar5;
  psVar1[0x10].i1_log2_max_transform_block_size = bVar14;
  if (-1 < (char)bVar14) {
    iVar19 = (int)(char)UVar10 + (int)cVar4;
    iVar21 = 5;
    if (iVar19 < 5) {
      iVar21 = iVar19;
    }
    if ((int)(uint)bVar14 <= iVar21) {
      cVar4 = psVar1[0x10].i1_log2_diff_max_min_coding_block_size +
              psVar1[0x10].i1_log2_min_coding_block_size;
      psVar1[0x10].i1_log2_ctb_size = cVar4;
      if ((((-1 < cVar5) && ('\x01' < psVar1[0x10].i1_log2_min_transform_block_size)) &&
          ('\x02' < psVar1[0x10].i1_log2_min_coding_block_size)) &&
         (0xfc < (byte)(cVar4 - 7U) && (char)bVar14 <= cVar4)) {
        psVar1[0x10].i1_log2_min_pcm_coding_block_size = '\0';
        psVar1[0x10].i1_log2_diff_max_min_pcm_coding_block_size = '\0';
        UVar10 = ihevcd_uev(ps_bitstrm);
        psVar1[0x10].i1_max_transform_hierarchy_depth_inter = (WORD8)UVar10;
        UVar10 = ihevcd_uev(ps_bitstrm);
        psVar1[0x10].i1_max_transform_hierarchy_depth_intra = (WORD8)UVar10;
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_scaling_list_enable_flag = (char)UVar10;
        memcpy(psVar1[0x10].pi2_scaling_mat,gi2_flat_scale_mat_32x32,0xc0);
        if ((char)UVar10 == '\0') {
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x60,gi2_flat_scale_mat_32x32,0x300);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x1e0,gi2_flat_scale_mat_32x32,0x600);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x4e0,gi2_flat_scale_mat_32x32,0x600);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x7e0,gi2_flat_scale_mat_32x32,0x800);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0xbe0,gi2_flat_scale_mat_32x32,0x800);
        }
        else {
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x60,gi2_intra_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0xa0,gi2_intra_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0xe0,gi2_intra_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x120,gi2_inter_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x160,gi2_inter_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x1a0,gi2_inter_default_scale_mat_8x8,0x80);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x1e0,gi2_intra_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x2e0,gi2_intra_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x3e0,gi2_intra_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x4e0,gi2_inter_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x5e0,gi2_inter_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x6e0,gi2_inter_default_scale_mat_16x16,0x200);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0x7e0,gi2_intra_default_scale_mat_32x32,0x800);
          memcpy(psVar1[0x10].pi2_scaling_mat + 0xbe0,gi2_inter_default_scale_mat_32x32,0x800);
          UVar10 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_sps_scaling_list_data_present_flag = (char)UVar10;
          if ((char)UVar10 != '\0') {
            ihevcd_scaling_list_data(ps_codec,psVar1[0x10].pi2_scaling_mat);
          }
        }
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_amp_enabled_flag = (WORD8)UVar10;
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_sample_adaptive_offset_enabled_flag = (WORD8)UVar10;
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_pcm_enabled_flag = (char)UVar10;
        if ((char)UVar10 != '\0') {
          UVar10 = ihevcd_bits_get(ps_bitstrm,4);
          psVar1[0x10].i1_pcm_sample_bit_depth_luma = (char)UVar10 + '\x01';
          UVar10 = ihevcd_bits_get(ps_bitstrm,4);
          psVar1[0x10].i1_pcm_sample_bit_depth_chroma = (char)UVar10 + '\x01';
          UVar10 = ihevcd_uev(ps_bitstrm);
          psVar1[0x10].i1_log2_min_pcm_coding_block_size = (char)UVar10 + '\x03';
          UVar10 = ihevcd_uev(ps_bitstrm);
          psVar1[0x10].i1_log2_diff_max_min_pcm_coding_block_size = (WORD8)UVar10;
          UVar10 = ihevcd_bits_get(ps_bitstrm,1);
          psVar1[0x10].i1_pcm_loop_filter_disable_flag = (WORD8)UVar10;
        }
        UVar10 = ihevcd_uev(ps_bitstrm);
        bVar6 = (byte)UVar10;
        bVar14 = 0;
        if (-1 < (char)bVar6) {
          bVar14 = bVar6;
        }
        bVar7 = 0x40;
        if ((char)bVar6 < 'A') {
          bVar7 = bVar14;
        }
        psVar1[0x10].i1_num_short_term_ref_pic_sets = bVar7;
        if ('\0' < (char)bVar7) {
          uVar16 = (ulong)bVar7;
          lVar17 = 0;
          ps_stref_picset = psVar1[0x10].as_stref_picset;
          do {
            ihevcd_short_term_ref_pic_set
                      (ps_bitstrm,psVar1[0x10].as_stref_picset,(WORD32)uVar16,(WORD32)lVar17,
                       ps_stref_picset);
            lVar17 = lVar17 + 1;
            uVar16 = (ulong)psVar1[0x10].i1_num_short_term_ref_pic_sets;
            ps_stref_picset = ps_stref_picset + 1;
          } while (lVar17 < (long)uVar16);
        }
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_long_term_ref_pics_present_flag = (char)UVar10;
        if ((char)UVar10 != '\0') {
          UVar10 = ihevcd_uev(ps_bitstrm);
          psVar1[0x10].i1_num_long_term_ref_pics_sps = (char)UVar10;
          if ('\0' < (char)UVar10) {
            lVar17 = 0;
            do {
              UVar10 = ihevcd_bits_get(ps_bitstrm,(int)psVar1[0x10].i1_log2_max_pic_order_cnt_lsb);
              psVar1[0x10].au2_lt_ref_pic_poc_lsb_sps[lVar17] = (UWORD16)UVar10;
              UVar10 = ihevcd_bits_get(ps_bitstrm,1);
              psVar1[0x10].ai1_used_by_curr_pic_lt_sps_flag[lVar17] = (WORD8)UVar10;
              lVar17 = lVar17 + 1;
            } while (lVar17 < psVar1[0x10].i1_num_long_term_ref_pics_sps);
          }
        }
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_sps_temporal_mvp_enable_flag = (WORD8)UVar10;
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_strong_intra_smoothing_enable_flag = (WORD8)UVar10;
        UVar10 = ihevcd_bits_get(ps_bitstrm,1);
        psVar1[0x10].i1_vui_parameters_present_flag = (char)UVar10;
        if ((char)UVar10 != '\0') {
          ihevcd_parse_vui_parameters
                    (ps_bitstrm,&psVar1[0x10].s_vui_parameters,
                     psVar1[0x10].i1_sps_max_sub_layers + -1);
        }
        ihevcd_bits_get(ps_bitstrm,1);
        iVar21 = 1 << (psVar1[0x10].i1_log2_ctb_size & 0x1fU);
        iVar19 = (int)psVar1[0x10].i2_pic_width_in_luma_samples;
        sVar8 = (short)((iVar21 + iVar19 + -1) / iVar21);
        psVar1[0x10].i2_pic_wd_in_ctb = sVar8;
        iVar20 = (int)psVar1[0x10].i2_pic_height_in_luma_samples;
        sVar3 = (short)((iVar21 + iVar20 + -1) / iVar21);
        psVar1[0x10].i2_pic_ht_in_ctb = sVar3;
        iVar21 = (int)sVar8 * (int)sVar3;
        psVar1[0x10].i4_pic_size_in_ctb = iVar21;
        if (ps_codec->i4_sps_done == 0) {
          (ps_codec->s_parse).i4_next_ctb_indx = iVar21;
        }
        iVar21 = 1 << (psVar1[0x10].i1_log2_min_coding_block_size & 0x1fU);
        psVar1[0x10].i2_pic_wd_in_min_cb = (WORD16)(iVar19 / iVar21);
        psVar1[0x10].i2_pic_ht_in_min_cb = (WORD16)(iVar20 / iVar21);
        if ((ps_codec->i4_first_pic_done != 0) &&
           ((ps_codec->i4_wd != iVar19 || (ps_codec->i4_ht != iVar20)))) {
          ps_codec->i4_reset_flag = 1;
          return 0x2a;
        }
        if (0x2100 < iVar19) {
          return 0x11;
        }
        if (0x22ce000 < iVar20 * iVar19) {
          return 0x11;
        }
        bVar22 = psVar1[0x10].i1_chroma_format_idc == '\x01';
        iVar21 = (int)psVar1[0x10].i2_pic_crop_right_offset +
                 (int)psVar1[0x10].i2_pic_crop_left_offset << bVar22;
        uVar13 = iVar19 - iVar21;
        if (uVar13 != 0 && iVar21 <= iVar19) {
          iVar21 = iVar20 - ((int)psVar1[0x10].i2_pic_crop_bottom_offset +
                             (int)psVar1[0x10].i2_pic_crop_top_offset << bVar22);
          if (0 < iVar21) {
            ps_codec->i4_disp_wd = uVar13;
            ps_codec->i4_disp_ht = iVar21;
            ps_codec->i4_wd = iVar19;
            ps_codec->i4_ht = iVar20;
            uVar18 = iVar19 + 0xbfU & 0xffffffe0;
            uVar15 = ps_codec->i4_strd;
            if (ps_codec->i4_strd < (int)uVar18) {
              ps_codec->i4_strd = uVar18;
              uVar15 = uVar18;
            }
            if (ps_codec->i4_share_disp_buf != 0) {
              uVar13 = uVar15;
            }
            if (ps_codec->i4_disp_strd < (int)uVar13) {
              ps_codec->i4_disp_strd = uVar13;
            }
            ps_codec->i4_sps_done = 1;
            return 0;
          }
          return IHEVCD_INVALID_PARAMETER;
        }
      }
    }
  }
  return IHEVCD_INVALID_PARAMETER;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_sps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;

    WORD32 i;
    WORD32 vps_id;
    WORD32 sps_max_sub_layers;
    WORD32 sps_id;
    WORD32 sps_temporal_id_nesting_flag;
    sps_t *ps_sps;
    profile_tier_lvl_info_t s_ptl;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD32 ctb_log2_size_y = 0;


    BITS_PARSE("video_parameter_set_id", value, ps_bitstrm, 4);
    vps_id = value;
    vps_id = CLIP3(vps_id, 0, MAX_VPS_CNT - 1);

    BITS_PARSE("sps_max_sub_layers_minus1", value, ps_bitstrm, 3);
    sps_max_sub_layers = value + 1;
    sps_max_sub_layers = CLIP3(sps_max_sub_layers, 1, 7);

    BITS_PARSE("sps_temporal_id_nesting_flag", value, ps_bitstrm, 1);
    sps_temporal_id_nesting_flag = value;

    //profile_and_level( 1, sps_max_sub_layers_minus1 )
    ret = ihevcd_profile_tier_level(ps_bitstrm, &(s_ptl), 1,
                                    (sps_max_sub_layers - 1));

    UEV_PARSE("seq_parameter_set_id", value, ps_bitstrm);
    sps_id = value;

    if((sps_id >= MAX_SPS_CNT) || (sps_id < 0))
    {
        if(ps_codec->i4_sps_done)
            return IHEVCD_UNSUPPORTED_SPS_ID;
        else
            sps_id = 0;
    }


    ps_sps = (ps_codec->s_parse.ps_sps_base + MAX_SPS_CNT - 1);
    ps_sps->i1_sps_id = sps_id;
    ps_sps->i1_vps_id = vps_id;
    ps_sps->i1_sps_max_sub_layers = sps_max_sub_layers;
    ps_sps->i1_sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;
    /* This is used only during initialization to get reorder count etc */
    ps_codec->i4_sps_id = sps_id;
    memcpy(&ps_sps->s_ptl, &s_ptl, sizeof(profile_tier_lvl_info_t));

    UEV_PARSE("chroma_format_idc", value, ps_bitstrm);
    ps_sps->i1_chroma_format_idc = value;

    if(ps_sps->i1_chroma_format_idc != CHROMA_FMT_IDC_YUV420)
    {
        ps_codec->s_parse.i4_error_code = IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
        return (IHEVCD_ERROR_T)IHEVCD_UNSUPPORTED_CHROMA_FMT_IDC;
    }

    if(CHROMA_FMT_IDC_YUV444_PLANES == ps_sps->i1_chroma_format_idc)
    {
        BITS_PARSE("separate_colour_plane_flag", value, ps_bitstrm, 1);
        ps_sps->i1_separate_colour_plane_flag = value;
    }
    else
    {
        ps_sps->i1_separate_colour_plane_flag = 0;
    }

    UEV_PARSE("pic_width_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_width_in_luma_samples = value;

    UEV_PARSE("pic_height_in_luma_samples", value, ps_bitstrm);
    ps_sps->i2_pic_height_in_luma_samples = value;

    if((0 >= ps_sps->i2_pic_width_in_luma_samples) || (0 >= ps_sps->i2_pic_height_in_luma_samples))
        return IHEVCD_INVALID_PARAMETER;

    /* i2_pic_width_in_luma_samples and i2_pic_height_in_luma_samples
       should be multiples of min_cb_size. Here these are aligned to 8,
       i.e. smallest CB size */
    ps_sps->i2_pic_width_in_luma_samples = ALIGN8(ps_sps->i2_pic_width_in_luma_samples);
    ps_sps->i2_pic_height_in_luma_samples = ALIGN8(ps_sps->i2_pic_height_in_luma_samples);

    BITS_PARSE("pic_cropping_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pic_cropping_flag = value;

    if(ps_sps->i1_pic_cropping_flag)
    {

        UEV_PARSE("pic_crop_left_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_left_offset = value;

        UEV_PARSE("pic_crop_right_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_right_offset = value;

        UEV_PARSE("pic_crop_top_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_top_offset = value;

        UEV_PARSE("pic_crop_bottom_offset", value, ps_bitstrm);
        ps_sps->i2_pic_crop_bottom_offset = value;
    }
    else
    {
        ps_sps->i2_pic_crop_left_offset = 0;
        ps_sps->i2_pic_crop_right_offset = 0;
        ps_sps->i2_pic_crop_top_offset = 0;
        ps_sps->i2_pic_crop_bottom_offset = 0;
    }


    UEV_PARSE("bit_depth_luma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("bit_depth_chroma_minus8", value, ps_bitstrm);
    if(0 != value)
        return IHEVCD_UNSUPPORTED_BIT_DEPTH;

    UEV_PARSE("log2_max_pic_order_cnt_lsb_minus4", value, ps_bitstrm);
    ps_sps->i1_log2_max_pic_order_cnt_lsb = value + 4;

    BITS_PARSE("sps_sub_layer_ordering_info_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_sub_layer_ordering_info_present_flag = value;


    i = (ps_sps->i1_sps_sub_layer_ordering_info_present_flag ? 0 : (ps_sps->i1_sps_max_sub_layers - 1));
    for(; i < ps_sps->i1_sps_max_sub_layers; i++)
    {
        UEV_PARSE("max_dec_pic_buffering", value, ps_bitstrm);
        ps_sps->ai1_sps_max_dec_pic_buffering[i] = value + 1;

        if(ps_sps->ai1_sps_max_dec_pic_buffering[i] > MAX_DPB_SIZE)
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("num_reorder_pics", value, ps_bitstrm);
        ps_sps->ai1_sps_max_num_reorder_pics[i] = value;

        if(ps_sps->ai1_sps_max_num_reorder_pics[i] > ps_sps->ai1_sps_max_dec_pic_buffering[i])
        {
            return IHEVCD_INVALID_PARAMETER;
        }

        UEV_PARSE("max_latency_increase", value, ps_bitstrm);
        ps_sps->ai1_sps_max_latency_increase[i] = value;
    }

    /* Check if sps_max_dec_pic_buffering or sps_max_num_reorder_pics
       has changed */
    if(0 != ps_codec->i4_first_pic_done)
    {
        sps_t *ps_sps_old = ps_codec->s_parse.ps_sps;
        if(ps_sps_old->ai1_sps_max_dec_pic_buffering[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_dec_pic_buffering[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }

        if(ps_sps_old->ai1_sps_max_num_reorder_pics[ps_sps_old->i1_sps_max_sub_layers - 1] !=
                    ps_sps->ai1_sps_max_num_reorder_pics[ps_sps->i1_sps_max_sub_layers - 1])
        {
            ps_codec->i4_reset_flag = 1;
            return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
        }
    }

    UEV_PARSE("log2_min_coding_block_size_minus3", value, ps_bitstrm);
    ps_sps->i1_log2_min_coding_block_size = value + 3;

    UEV_PARSE("log2_diff_max_min_coding_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_coding_block_size = value;

    ctb_log2_size_y = ps_sps->i1_log2_min_coding_block_size + ps_sps->i1_log2_diff_max_min_coding_block_size;

    UEV_PARSE("log2_min_transform_block_size_minus2", value, ps_bitstrm);
    ps_sps->i1_log2_min_transform_block_size = value + 2;

    UEV_PARSE("log2_diff_max_min_transform_block_size", value, ps_bitstrm);
    ps_sps->i1_log2_diff_max_min_transform_block_size = value;

    ps_sps->i1_log2_max_transform_block_size = ps_sps->i1_log2_min_transform_block_size +
                    ps_sps->i1_log2_diff_max_min_transform_block_size;

    if ((ps_sps->i1_log2_max_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > MIN(ctb_log2_size_y, 5)))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_ctb_size = ps_sps->i1_log2_min_coding_block_size +
                    ps_sps->i1_log2_diff_max_min_coding_block_size;

    if((ps_sps->i1_log2_min_coding_block_size < 3) ||
                    (ps_sps->i1_log2_min_transform_block_size < 2) ||
                    (ps_sps->i1_log2_diff_max_min_transform_block_size < 0) ||
                    (ps_sps->i1_log2_max_transform_block_size > ps_sps->i1_log2_ctb_size) ||
                    (ps_sps->i1_log2_ctb_size < 4) ||
                    (ps_sps->i1_log2_ctb_size > 6))
    {
        return IHEVCD_INVALID_PARAMETER;
    }

    ps_sps->i1_log2_min_pcm_coding_block_size = 0;
    ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = 0;

    UEV_PARSE("max_transform_hierarchy_depth_inter", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_inter = value;

    UEV_PARSE("max_transform_hierarchy_depth_intra", value, ps_bitstrm);
    ps_sps->i1_max_transform_hierarchy_depth_intra = value;

    /* String has a d (enabled) in order to match with HM */
    BITS_PARSE("scaling_list_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_scaling_list_enable_flag = value;

    if(ps_sps->i1_scaling_list_enable_flag)
    {
        COPY_DEFAULT_SCALING_LIST(ps_sps->pi2_scaling_mat);
        BITS_PARSE("sps_scaling_list_data_present_flag", value, ps_bitstrm, 1);
        ps_sps->i1_sps_scaling_list_data_present_flag = value;

        if(ps_sps->i1_sps_scaling_list_data_present_flag)
            ihevcd_scaling_list_data(ps_codec, ps_sps->pi2_scaling_mat);
    }
    else
    {
        COPY_FLAT_SCALING_LIST(ps_sps->pi2_scaling_mat);
    }
    /* String is asymmetric_motion_partitions_enabled_flag instead of amp_enabled_flag in order to match with HM */
    BITS_PARSE("asymmetric_motion_partitions_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_amp_enabled_flag = value;

    BITS_PARSE("sample_adaptive_offset_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sample_adaptive_offset_enabled_flag = value;

    BITS_PARSE("pcm_enabled_flag", value, ps_bitstrm, 1);
    ps_sps->i1_pcm_enabled_flag = value;

    if(ps_sps->i1_pcm_enabled_flag)
    {
        BITS_PARSE("pcm_sample_bit_depth_luma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_luma = value + 1;

        BITS_PARSE("pcm_sample_bit_depth_chroma", value, ps_bitstrm, 4);
        ps_sps->i1_pcm_sample_bit_depth_chroma = value + 1;

        UEV_PARSE("log2_min_pcm_coding_block_size_minus3", value, ps_bitstrm);
        ps_sps->i1_log2_min_pcm_coding_block_size = value + 3;

        UEV_PARSE("log2_diff_max_min_pcm_coding_block_size", value, ps_bitstrm);
        ps_sps->i1_log2_diff_max_min_pcm_coding_block_size = value;
        BITS_PARSE("pcm_loop_filter_disable_flag", value, ps_bitstrm, 1);
        ps_sps->i1_pcm_loop_filter_disable_flag = value;

    }
    UEV_PARSE("num_short_term_ref_pic_sets", value, ps_bitstrm);
    ps_sps->i1_num_short_term_ref_pic_sets = value;

    ps_sps->i1_num_short_term_ref_pic_sets = CLIP3(ps_sps->i1_num_short_term_ref_pic_sets, 0, MAX_STREF_PICS_SPS);

    for(i = 0; i < ps_sps->i1_num_short_term_ref_pic_sets; i++)
        ihevcd_short_term_ref_pic_set(ps_bitstrm, &ps_sps->as_stref_picset[0], ps_sps->i1_num_short_term_ref_pic_sets, i, &ps_sps->as_stref_picset[i]);

    BITS_PARSE("long_term_ref_pics_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_long_term_ref_pics_present_flag = value;

    if(ps_sps->i1_long_term_ref_pics_present_flag)
    {
        UEV_PARSE("num_long_term_ref_pics_sps", value, ps_bitstrm);
        ps_sps->i1_num_long_term_ref_pics_sps = value;

        for(i = 0; i < ps_sps->i1_num_long_term_ref_pics_sps; i++)
        {
            BITS_PARSE("lt_ref_pic_poc_lsb_sps[ i ]", value, ps_bitstrm, ps_sps->i1_log2_max_pic_order_cnt_lsb);
            ps_sps->au2_lt_ref_pic_poc_lsb_sps[i] = value;

            BITS_PARSE("used_by_curr_pic_lt_sps_flag[ i ]", value, ps_bitstrm, 1);
            ps_sps->ai1_used_by_curr_pic_lt_sps_flag[i] = value;
        }
    }

    BITS_PARSE("sps_temporal_mvp_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_sps_temporal_mvp_enable_flag = value;

    /* Print matches HM 8-2 */
    BITS_PARSE("sps_strong_intra_smoothing_enable_flag", value, ps_bitstrm, 1);
    ps_sps->i1_strong_intra_smoothing_enable_flag = value;

    BITS_PARSE("vui_parameters_present_flag", value, ps_bitstrm, 1);
    ps_sps->i1_vui_parameters_present_flag = value;

    if(ps_sps->i1_vui_parameters_present_flag)
        ihevcd_parse_vui_parameters(ps_bitstrm,
                                    &ps_sps->s_vui_parameters,
                                    ps_sps->i1_sps_max_sub_layers - 1);

    BITS_PARSE("sps_extension_flag", value, ps_bitstrm, 1);


    {
        WORD32 numerator;
        WORD32 ceil_offset;

        ceil_offset = (1 << ps_sps->i1_log2_ctb_size) - 1;
        numerator = ps_sps->i2_pic_width_in_luma_samples;

        ps_sps->i2_pic_wd_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_ctb = ((numerator + ceil_offset) /
                        (1 << ps_sps->i1_log2_ctb_size));

        ps_sps->i4_pic_size_in_ctb = ps_sps->i2_pic_ht_in_ctb *
                        ps_sps->i2_pic_wd_in_ctb;

        if(0 == ps_codec->i4_sps_done)
            ps_codec->s_parse.i4_next_ctb_indx = ps_sps->i4_pic_size_in_ctb;

        numerator = ps_sps->i2_pic_width_in_luma_samples;
        ps_sps->i2_pic_wd_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);

        numerator = ps_sps->i2_pic_height_in_luma_samples;
        ps_sps->i2_pic_ht_in_min_cb = numerator  /
                        (1 << ps_sps->i1_log2_min_coding_block_size);
    }
    if((0 != ps_codec->i4_first_pic_done) &&
                    ((ps_codec->i4_wd != ps_sps->i2_pic_width_in_luma_samples) ||
                    (ps_codec->i4_ht != ps_sps->i2_pic_height_in_luma_samples)))
    {
        ps_codec->i4_reset_flag = 1;
        return (IHEVCD_ERROR_T)IVD_RES_CHANGED;
    }

    if((ps_sps->i2_pic_width_in_luma_samples > MAX_WD) ||
                    ((ps_sps->i2_pic_width_in_luma_samples * ps_sps->i2_pic_height_in_luma_samples) >
                    (MAX_WD * MAX_HT)))
    {
        return (IHEVCD_ERROR_T)IVD_STREAM_WIDTH_HEIGHT_NOT_SUPPORTED;
    }

    /* Update display width and display height */
    {
        WORD32 disp_wd, disp_ht;
        WORD32 crop_unit_x, crop_unit_y;
        crop_unit_x = 1;
        crop_unit_y = 1;

        if(CHROMA_FMT_IDC_YUV420 == ps_sps->i1_chroma_format_idc)
        {
            crop_unit_x = 2;
            crop_unit_y = 2;
        }

        disp_wd = ps_sps->i2_pic_width_in_luma_samples;
        disp_wd -= ps_sps->i2_pic_crop_left_offset * crop_unit_x;
        disp_wd -= ps_sps->i2_pic_crop_right_offset * crop_unit_x;


        disp_ht = ps_sps->i2_pic_height_in_luma_samples;
        disp_ht -= ps_sps->i2_pic_crop_top_offset * crop_unit_y;
        disp_ht -= ps_sps->i2_pic_crop_bottom_offset * crop_unit_y;

        if((0 >= disp_wd) || (0 >= disp_ht))
            return IHEVCD_INVALID_PARAMETER;

        ps_codec->i4_disp_wd = disp_wd;
        ps_codec->i4_disp_ht = disp_ht;


        ps_codec->i4_wd = ps_sps->i2_pic_width_in_luma_samples;
        ps_codec->i4_ht = ps_sps->i2_pic_height_in_luma_samples;

        {
            WORD32 ref_strd;
            ref_strd = ALIGN32(ps_sps->i2_pic_width_in_luma_samples + PAD_WD);
            if(ps_codec->i4_strd < ref_strd)
            {
                ps_codec->i4_strd = ref_strd;
            }
        }

        if(0 == ps_codec->i4_share_disp_buf)
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_disp_wd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_disp_wd;
            }
        }
        else
        {
            if(ps_codec->i4_disp_strd < ps_codec->i4_strd)
            {
                ps_codec->i4_disp_strd = ps_codec->i4_strd;
            }
        }
    }

    ps_codec->i4_sps_done = 1;
    return ret;
}